

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,Descriptor *descriptor,
          bool immutable,bool kotlin)

{
  FileDescriptor *file;
  _Alloc_hider _Var1;
  bool bVar2;
  string_view name_without_package;
  string local_50;
  
  java::(anonymous_namespace)::ClassNameWithoutPackage_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)(descriptor->all_names_).payload_,
             (Descriptor *)descriptor->file_->package_->_M_string_length,immutable);
  _Var1._M_p = local_50._M_dataplus._M_p;
  file = descriptor->file_;
  bVar2 = NestedInFileClass(descriptor,immutable);
  name_without_package._M_str = _Var1._M_p;
  name_without_package._M_len = local_50._M_string_length;
  GetClassFullName_abi_cxx11_
            (__return_storage_ptr__,this,name_without_package,file,immutable,!bVar2,kotlin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetClassName(const Descriptor* descriptor,
                                            bool immutable, bool kotlin) {
  return GetClassFullName(ClassNameWithoutPackage(descriptor, immutable),
                          descriptor->file(), immutable,
                          !NestedInFileClass(*descriptor, immutable), kotlin);
}